

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dic_adapter.c
# Opt level: O3

size_t SIMPLE_conv_string_to_letters(char *s,MAFSA_letter *l,size_t sz_l)

{
  ulong uVar1;
  char cVar2;
  byte bVar3;
  
  cVar2 = *s;
  if (sz_l == 0 || cVar2 == '\0') {
    return 0;
  }
  uVar1 = 0;
  do {
    if (cVar2 == ' ') {
      bVar3 = 0x1c;
    }
    else if (cVar2 == '-') {
      bVar3 = 0x1a;
    }
    else if (cVar2 == '\'') {
      bVar3 = 0x1b;
    }
    else {
      bVar3 = cVar2 + 0xbf;
      if ((0x19 < bVar3) && (bVar3 = cVar2 + 0x9f, 0x19 < bVar3)) {
        return uVar1;
      }
    }
    l[uVar1] = bVar3;
    cVar2 = s[uVar1 + 1];
    uVar1 = uVar1 + 1;
    if (cVar2 == '\0') {
      return uVar1;
    }
  } while (uVar1 < sz_l);
  return uVar1;
}

Assistant:

size_t SIMPLE_conv_string_to_letters(const char *s, MAFSA_letter *l, size_t sz_l)
{
	size_t pos;
	for (pos = 0; *s && pos < sz_l; ++s, ++pos)
	{
		char c = *s;

		if ('-' == c)
		{
			l[pos] = SIMPLE_LETTER_DEFIS;
		}
		else if ('\'' == c)
		{
			l[pos] = SIMPLE_LETTER_APOSTROPHE;
		}
		else if (' ' == c)
		{
			l[pos] = SIMPLE_LETTER_SPACE;
		}
		else
		{
			if ('A' <= c && c <= 'Z')
			{
				l[pos] = c - 'A';
			}
			else if ('a' <= c && c <= 'z')
			{
				l[pos] = c - 'a';
			}
			else
			{
				break;
			}
		}
	}

	return pos;
}